

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

void RegisterRawTransactionRPCCommands(CRPCTable *t)

{
  int iVar1;
  long in_FS_OFFSET;
  CRPCCommand *c;
  CRPCCommand *__end1;
  CRPCCommand *__begin1;
  CRPCCommand (*__range1) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  string *in_stack_fffffffffffffd40;
  CRPCTable *in_stack_fffffffffffffd48;
  CRPCCommand *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  string *category;
  CRPCCommand *in_stack_fffffffffffffd68;
  CRPCCommand *this;
  allocator<char> *in_stack_fffffffffffffd78;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd80;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CRPCCommand *local_228;
  allocator<char> local_1f7;
  undefined1 local_1f6;
  undefined1 local_1f5;
  undefined1 local_1f4 [2];
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  undefined1 local_1f0 [2];
  allocator<char> local_1ee;
  allocator<char> local_1ed;
  allocator<char> local_1ec;
  allocator<char> local_1eb;
  allocator<char> local_1ea;
  allocator<char> local_1e9 [481];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterRawTransactionRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterRawTransactionRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      __s = &local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)__s,in_stack_fffffffffffffd78);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      __a = &local_1f2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (RpcMethodFnType)in_stack_fffffffffffffd58);
      this = (CRPCCommand *)local_1f4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (this,in_stack_fffffffffffffd60,(RpcMethodFnType)in_stack_fffffffffffffd58);
      category = (string *)&local_1f5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd58 = (CRPCCommand *)&local_1f6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffd58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffd58);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_1f7);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f6);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f5);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator((allocator<char> *)local_1f4);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator((allocator<char> *)(local_1f4 + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_1f2);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_1f1);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator((allocator<char> *)local_1f0);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator((allocator<char> *)(local_1f0 + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_1ee);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_1ed);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_1ec);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_1eb);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_1ea);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(local_1e9);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterRawTransactionRPCCommands(CRPCTable&)::commands);
    }
  }
  for (local_228 = RegisterRawTransactionRPCCommands::commands;
      local_228 != (CRPCCommand *)&RegisterRawTransactionRPCCommands(CRPCTable&)::commands;
      local_228 = local_228 + 1) {
    CRPCTable::appendCommand
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterRawTransactionRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"rawtransactions", &getrawtransaction},
        {"rawtransactions", &createrawtransaction},
        {"rawtransactions", &decoderawtransaction},
        {"rawtransactions", &decodescript},
        {"rawtransactions", &combinerawtransaction},
        {"rawtransactions", &signrawtransactionwithkey},
        {"rawtransactions", &decodepsbt},
        {"rawtransactions", &combinepsbt},
        {"rawtransactions", &finalizepsbt},
        {"rawtransactions", &createpsbt},
        {"rawtransactions", &converttopsbt},
        {"rawtransactions", &utxoupdatepsbt},
        {"rawtransactions", &descriptorprocesspsbt},
        {"rawtransactions", &joinpsbts},
        {"rawtransactions", &analyzepsbt},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}